

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_18::Poppifier::patchScope(Poppifier *this,Expression **expr)

{
  pointer pSVar1;
  pointer ppEVar2;
  Expression *pEVar3;
  Block *pBVar4;
  optional<wasm::Type> type;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_30;
  
  pSVar1 = (this->scopeStack).
           super__Vector_base<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_30.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       pSVar1[-1].instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_30.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       pSVar1[-1].instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       pSVar1[-1].instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pSVar1[-1].instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pSVar1[-1].instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1[-1].instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = (this->scopeStack).
           super__Vector_base<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->scopeStack).
  super__Vector_base<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar1 + -1;
  ppEVar2 = pSVar1[-1].instrs.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)pSVar1[-1].instrs.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2
                   );
  }
  pEVar3 = *expr;
  if (pEVar3->_id == BlockId) {
    if ((local_30.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_finish ==
         local_30.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_start) ||
       (*local_30.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_start != pEVar3)) {
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar3 + 2),
                 &local_30);
    }
  }
  else {
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)(pEVar3->type).id;
    pBVar4 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       (&this->builder,&local_30,type);
    *expr = (Expression *)pBVar4;
  }
  if (local_30.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Poppifier::patchScope(Expression*& expr) {
  auto scope = std::move(scopeStack.back());
  auto& instrs = scope.instrs;
  scopeStack.pop_back();
  if (auto* block = expr->dynCast<Block>()) {
    // Reuse blocks, but do not patch a block into itself, which would otherwise
    // happen when emitting if/else or try/catch arms and function bodies.
    if (instrs.size() == 0 || instrs[0] != block) {
      block->list.set(instrs);
    }
  } else {
    // Otherwise create a new block, even if we have just a single
    // expression. We want blocks in every new scope rather than other
    // instructions because Poppy IR optimizations only look at the children of
    // blocks.
    expr = builder.makeBlock(instrs, expr->type);
  }
}